

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportedUgrid.hpp
# Opt level: O3

void __thiscall
Parfait::ImportedUgrid::ImportedUgrid
          (ImportedUgrid *this,vector<double,_std::allocator<double>_> *nodes_in,
          vector<int,_std::allocator<int>_> *triangles_in,
          vector<int,_std::allocator<int>_> *quads_in,vector<int,_std::allocator<int>_> *tets_in,
          vector<int,_std::allocator<int>_> *pyramids_in,
          vector<int,_std::allocator<int>_> *prisms_in,vector<int,_std::allocator<int>_> *hexs_in,
          vector<int,_std::allocator<int>_> *triangleTags_in,
          vector<int,_std::allocator<int>_> *quadTags_in)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  iterator iVar4;
  int local_64 [3];
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  std::vector<double,_std::allocator<double>_>::vector(&this->nodes,nodes_in);
  local_58 = &this->cellMap;
  local_50 = &this->faceMap;
  local_38 = &this->triangles;
  (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_38,triangles_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->quads,quads_in);
  local_40 = &this->quads;
  std::vector<int,_std::allocator<int>_>::vector(&this->tets,tets_in);
  local_48 = &this->tets;
  std::vector<int,_std::allocator<int>_>::vector(&this->pyramids,pyramids_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->prisms,prisms_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->hexs,hexs_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->triangleTags,triangleTags_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->quadTags,quadTags_in);
  (this->associated_component_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->associated_component_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->associated_component_id).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nnodes = (int)((ulong)((long)(this->nodes).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->nodes).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3) / 3;
  iVar1 = (int)((ulong)((long)(this->tets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->tets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  local_64[0] = iVar1 + 3;
  if (-1 < iVar1) {
    local_64[0] = iVar1;
  }
  local_64[0] = local_64[0] >> 2;
  iVar4._M_current =
       (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  piVar2 = (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar4._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_58,iVar4,local_64);
    iVar4._M_current =
         (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_64[0];
    iVar4._M_current = iVar4._M_current + 1;
    (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current;
  }
  local_64[0] = (int)((ulong)((long)(this->pyramids).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->pyramids).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2) / 5 +
                iVar4._M_current[-1];
  if (iVar4._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_58,iVar4,local_64);
    iVar4._M_current =
         (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_64[0];
    iVar4._M_current = iVar4._M_current + 1;
    (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current;
  }
  local_64[0] = (int)((ulong)((long)(this->prisms).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->prisms).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2) / 6 +
                iVar4._M_current[-1];
  if (iVar4._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_58,iVar4,local_64);
    iVar4._M_current =
         (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_64[0];
    iVar4._M_current = iVar4._M_current + 1;
    (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current;
  }
  iVar1 = (int)((ulong)((long)(this->hexs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->hexs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  iVar3 = iVar1 + 7;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  local_64[0] = (iVar3 >> 3) + iVar4._M_current[-1];
  if (iVar4._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_58,iVar4,local_64);
  }
  else {
    *iVar4._M_current = local_64[0];
    (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  local_64[0] = (int)((ulong)((long)(this->triangles).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->triangles).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2) / 3;
  iVar4._M_current =
       (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  piVar2 = (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar4._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_50,iVar4,local_64);
    iVar4._M_current =
         (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_64[0];
    iVar4._M_current = iVar4._M_current + 1;
    (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current;
  }
  iVar1 = (int)((ulong)((long)(this->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->quads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  iVar3 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  local_64[0] = (iVar3 >> 2) + iVar4._M_current[-1];
  if (iVar4._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_50,iVar4,local_64);
    piVar2 = (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = local_64[0];
    piVar2 = iVar4._M_current + 1;
    (this->faceMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  this->ncells = (this->cellMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1];
  this->nfaces = piVar2[-1];
  return;
}

Assistant:

inline Parfait::ImportedUgrid::ImportedUgrid(std::vector<double> nodes_in,
																						 std::vector<int> triangles_in,
																						 std::vector<int> quads_in,
																						 std::vector<int> tets_in,
																						 std::vector<int> pyramids_in, 
																						 std::vector<int> prisms_in,
																						 std::vector<int> hexs_in, 
																						 std::vector<int> triangleTags_in, 
																						 std::vector<int> quadTags_in)
	: nodes(nodes_in),
	triangles(triangles_in),
	quads(quads_in),
	tets(tets_in),
	pyramids(pyramids_in),
	prisms(prisms_in),
	hexs(hexs_in),
    triangleTags(triangleTags_in),
    quadTags(quadTags_in)
{
	nnodes = (int)nodes.size()/3;
	cellMap.push_back((int)tets.size()/4);
	cellMap.push_back(cellMap.back() + (int)pyramids.size()/5);
	cellMap.push_back(cellMap.back() + (int)prisms.size()/6);
	cellMap.push_back(cellMap.back() + (int)hexs.size()/8);
	faceMap.push_back((int)triangles.size()/3);
	faceMap.push_back(faceMap.back() + (int)quads.size()/4);
	ncells = cellMap.back();
	nfaces = faceMap.back();
}